

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_parse_template_part(JSParseState *s,uint8_t *p)

{
  uint c;
  int iVar1;
  byte *pbVar2;
  JSValue JVar3;
  StringBuffer local_58;
  uint8_t *p_next;
  
  local_58.ctx = s->ctx;
  local_58.len = 0;
  local_58.size = 0x20;
  local_58.is_wide_char = 0;
  local_58.error_status = 0;
  local_58.str = js_alloc_string(local_58.ctx,0x20,0);
  if (local_58.str == (JSString *)0x0) {
    local_58._16_8_ = local_58._16_8_ & 0xffffffff;
    local_58.error_status = -1;
  }
  else {
    do {
      if (s->buf_end <= p) {
LAB_0010e19a:
        js_parse_error(s,"unexpected end of string");
        break;
      }
      pbVar2 = p + 1;
      c = (uint)*p;
      if (*p == 0x24) {
        if (*pbVar2 == 0x7b) {
          pbVar2 = p + 2;
LAB_0010e1de:
          (s->token).val = -0x7e;
          *(uint *)((long)&(s->token).u + 0x10) = c;
          JVar3 = string_buffer_end(&local_58);
          (s->token).u.str.str = JVar3;
          s->buf_ptr = pbVar2;
          return 0;
        }
      }
      else if (c == 0x5c) {
        iVar1 = string_buffer_putc8(&local_58,0x5c);
        if (iVar1 != 0) break;
        if (s->buf_end <= pbVar2) goto LAB_0010e19a;
        c = (uint)p[1];
        pbVar2 = p + 2;
      }
      else if (c == 0x60) goto LAB_0010e1de;
      if (c == 0xd) {
        pbVar2 = pbVar2 + (*pbVar2 == 10);
        c = 10;
      }
      p = pbVar2;
      if (c == 10) {
        s->line_num = s->line_num + 1;
        c = 10;
      }
      else if ((0x7f < c) &&
              (c = unicode_from_utf8(pbVar2 + -1,6,&p_next), p = p_next, 0x10ffff < c)) {
        js_parse_error(s,"invalid UTF-8 sequence");
        break;
      }
      iVar1 = string_buffer_putc(&local_58,c);
    } while (iVar1 == 0);
  }
  (*((local_58.ctx)->rt->mf).js_free)(&(local_58.ctx)->rt->malloc_state,local_58.str);
  return -1;
}

Assistant:

static __exception int js_parse_template_part(JSParseState *s, const uint8_t *p)
{
    uint32_t c;
    StringBuffer b_s, *b = &b_s;

    /* p points to the first byte of the template part */
    if (string_buffer_init(s->ctx, b, 32))
        goto fail;
    for(;;) {
        if (p >= s->buf_end)
            goto unexpected_eof;
        c = *p++;
        if (c == '`') {
            /* template end part */
            break;
        }
        if (c == '$' && *p == '{') {
            /* template start or middle part */
            p++;
            break;
        }
        if (c == '\\') {
            if (string_buffer_putc8(b, c))
                goto fail;
            if (p >= s->buf_end)
                goto unexpected_eof;
            c = *p++;
        }
        /* newline sequences are normalized as single '\n' bytes */
        if (c == '\r') {
            if (*p == '\n')
                p++;
            c = '\n';
        }
        if (c == '\n') {
            s->line_num++;
        } else if (c >= 0x80) {
            const uint8_t *p_next;
            c = unicode_from_utf8(p - 1, UTF8_CHAR_LEN_MAX, &p_next);
            if (c > 0x10FFFF) {
                js_parse_error(s, "invalid UTF-8 sequence");
                goto fail;
            }
            p = p_next;
        }
        if (string_buffer_putc(b, c))
            goto fail;
    }
    s->token.val = TOK_TEMPLATE;
    s->token.u.str.sep = c;
    s->token.u.str.str = string_buffer_end(b);
    s->buf_ptr = p;
    return 0;

 unexpected_eof:
    js_parse_error(s, "unexpected end of string");
 fail:
    string_buffer_free(b);
    return -1;
}